

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  ostream *poVar2;
  Colour colour;
  Version local_30;
  
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,'\n');
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam0000000000168a00 = 0x7e7e7e7e7e7e7e;
    uRam0000000000168a07._0_1_ = '~';
    uRam0000000000168a07._1_1_ = '~';
    uRam0000000000168a07._2_1_ = '~';
    uRam0000000000168a07._3_1_ = '~';
    uRam0000000000168a07._4_1_ = '~';
    uRam0000000000168a07._5_1_ = '~';
    uRam0000000000168a07._6_1_ = '~';
    uRam0000000000168a07._7_1_ = '~';
    DAT_001689f0 = '~';
    DAT_001689f0_1._0_1_ = '~';
    DAT_001689f0_1._1_1_ = '~';
    DAT_001689f0_1._2_1_ = '~';
    DAT_001689f0_1._3_1_ = '~';
    DAT_001689f0_1._4_1_ = '~';
    DAT_001689f0_1._5_1_ = '~';
    DAT_001689f0_1._6_1_ = '~';
    uRam00000000001689f8 = 0x7e7e7e7e7e7e7e;
    DAT_001689ff = 0x7e;
    DAT_001689e0 = '~';
    DAT_001689e0_1._0_1_ = '~';
    DAT_001689e0_1._1_1_ = '~';
    DAT_001689e0_1._2_1_ = '~';
    DAT_001689e0_1._3_1_ = '~';
    DAT_001689e0_1._4_1_ = '~';
    DAT_001689e0_1._5_1_ = '~';
    DAT_001689e0_1._6_1_ = '~';
    uRam00000000001689e8._0_1_ = '~';
    uRam00000000001689e8._1_1_ = '~';
    uRam00000000001689e8._2_1_ = '~';
    uRam00000000001689e8._3_1_ = '~';
    uRam00000000001689e8._4_1_ = '~';
    uRam00000000001689e8._5_1_ = '~';
    uRam00000000001689e8._6_1_ = '~';
    uRam00000000001689e8._7_1_ = '~';
    DAT_001689d0 = '~';
    DAT_001689d0_1._0_1_ = '~';
    DAT_001689d0_1._1_1_ = '~';
    DAT_001689d0_1._2_1_ = '~';
    DAT_001689d0_1._3_1_ = '~';
    DAT_001689d0_1._4_1_ = '~';
    DAT_001689d0_1._5_1_ = '~';
    DAT_001689d0_1._6_1_ = '~';
    uRam00000000001689d8._0_1_ = '~';
    uRam00000000001689d8._1_1_ = '~';
    uRam00000000001689d8._2_1_ = '~';
    uRam00000000001689d8._3_1_ = '~';
    uRam00000000001689d8._4_1_ = '~';
    uRam00000000001689d8._5_1_ = '~';
    uRam00000000001689d8._6_1_ = '~';
    uRam00000000001689d8._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam00000000001689c8._0_1_ = '~';
    uRam00000000001689c8._1_1_ = '~';
    uRam00000000001689c8._2_1_ = '~';
    uRam00000000001689c8._3_1_ = '~';
    uRam00000000001689c8._4_1_ = '~';
    uRam00000000001689c8._5_1_ = '~';
    uRam00000000001689c8._6_1_ = '~';
    uRam00000000001689c8._7_1_ = '~';
    DAT_00168a0f = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,'\n');
  colour.m_moved = false;
  Colour::use(FileName);
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                           (string *)
                           (this->super_StreamingReporterBase).currentTestRunInfo.
                           super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  libraryVersion();
  operator<<(poVar2,&local_30);
  poVar2 = std::operator<<(poVar2," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"Randomness seeded to: ");
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n\n");
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << '\n' << getLineOfChars<'~'>() << '\n';
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion() << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }